

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

znzFile nifti_image_load_prep(nifti_image *nim)

{
  int iVar1;
  char *fname_00;
  long lVar2;
  znzFile local_68;
  char local_58 [8];
  char fname [22];
  char *tmpimgname;
  znzFile fp;
  size_t ioff;
  size_t ii;
  size_t ntot;
  nifti_image *nim_local;
  
  builtin_strncpy(local_58,"nifti_im",8);
  builtin_strncpy(fname,"age_load_prep",0xe);
  ntot = (size_t)nim;
  if ((((nim == (nifti_image *)0x0) || (nim->iname == (char *)0x0)) || (nim->nbyper < 1)) ||
     (nim->nvox == 0)) {
    if (0 < g_opts.debug) {
      if (nim == (nifti_image *)0x0) {
        fprintf(_stderr,"** ERROR: N_image_load: no nifti image\n");
      }
      else {
        fprintf(_stderr,"** ERROR: N_image_load: bad params (%p,%d,%u)\n",nim->iname,
                (ulong)(uint)nim->nbyper,nim->nvox & 0xffffffff);
      }
    }
    nim_local = (nifti_image *)0x0;
  }
  else {
    ii = nifti_get_volsize(nim);
    fname_00 = nifti_findimgname(*(char **)(ntot + 0x280),*(int *)(ntot + 0x1e8));
    unique0x100002df = fname_00;
    if (fname_00 == (char *)0x0) {
      if (0 < g_opts.debug) {
        fprintf(_stderr,"** no image file found for \'%s\'\n",*(undefined8 *)(ntot + 0x280));
      }
      nim_local = (nifti_image *)0x0;
    }
    else {
      iVar1 = nifti_is_gzfile(fname_00);
      tmpimgname = (char *)znzopen(fname_00,"rb",iVar1);
      if ((znzFile)tmpimgname == (znzFile)0x0) {
        if (0 < g_opts.debug) {
          fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_58,"cannot open data file",
                  stack0xffffffffffffffc0);
        }
        free(stack0xffffffffffffffc0);
        nim_local = (nifti_image *)0x0;
      }
      else {
        free(stack0xffffffffffffffc0);
        if (*(int *)(ntot + 0x288) < 0) {
          iVar1 = nifti_is_gzfile(*(char **)(ntot + 0x280));
          if (iVar1 != 0) {
            if (0 < g_opts.debug) {
              fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_58,
                      "negative offset for compressed file",*(undefined8 *)(ntot + 0x280));
            }
            Xznzclose((znzFile *)&tmpimgname);
            return (znzFile)0x0;
          }
          iVar1 = nifti_get_filesize(*(char **)(ntot + 0x280));
          ioff = (size_t)iVar1;
          if (ioff == 0) {
            if (0 < g_opts.debug) {
              fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_58,"empty data file",
                      *(undefined8 *)(ntot + 0x280));
            }
            Xznzclose((znzFile *)&tmpimgname);
            return (znzFile)0x0;
          }
          if (ii < ioff) {
            local_68 = (znzFile)(ioff - ii);
          }
          else {
            local_68 = (znzFile)0x0;
          }
          fp = local_68;
        }
        else {
          fp = (znzFile)(long)*(int *)(ntot + 0x288);
        }
        lVar2 = znzseek((znzFile)tmpimgname,(long)fp,0);
        if (lVar2 < 0) {
          fprintf(_stderr,"** could not seek to offset %u in file \'%s\'\n",(ulong)fp & 0xffffffff,
                  *(undefined8 *)(ntot + 0x280));
          Xznzclose((znzFile *)&tmpimgname);
          nim_local = (nifti_image *)0x0;
        }
        else {
          nim_local = (nifti_image *)tmpimgname;
        }
      }
    }
  }
  return (znzFile)nim_local;
}

Assistant:

static znzFile nifti_image_load_prep( nifti_image *nim )
{
   /* set up data space, open data file and seek, then call nifti_read_buffer */
   size_t  ntot , ii , ioff;
   znzFile fp;
   char   *tmpimgname;
   char    fname[] = { "nifti_image_load_prep" };

   /**- perform sanity checks */
   if( nim == NULL      || nim->iname == NULL ||
       nim->nbyper <= 0 || nim->nvox <= 0       )
   {
      if ( g_opts.debug > 0 ){
         if( !nim ) fprintf(stderr,"** ERROR: N_image_load: no nifti image\n");
         else fprintf(stderr,"** ERROR: N_image_load: bad params (%p,%d,%u)\n",
                      nim->iname, nim->nbyper, (unsigned)nim->nvox);
      }
      return NULL;
   }

   ntot = nifti_get_volsize(nim) ; /* total bytes to read */

   /**- open image data file */

   tmpimgname = nifti_findimgname(nim->iname , nim->nifti_type);
   if( tmpimgname == NULL ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** no image file found for '%s'\n",nim->iname);
      return NULL;
   }

   fp = znzopen(tmpimgname, "rb", nifti_is_gzfile(tmpimgname));
   if (znz_isnull(fp)){
       if(g_opts.debug > 0) LNI_FERR(fname,"cannot open data file",tmpimgname);
       free(tmpimgname);
       return NULL;  /* bad open? */
   }
   free(tmpimgname);

   /**- get image offset: a negative offset means to figure from end of file */
   if( nim->iname_offset < 0 ){
     if( nifti_is_gzfile(nim->iname) ){
        if( g_opts.debug > 0 )
           LNI_FERR(fname,"negative offset for compressed file",nim->iname);
        znzclose(fp);
        return NULL;
     }
     ii = nifti_get_filesize( nim->iname ) ;
     if( ii <= 0 ){
        if( g_opts.debug > 0 ) LNI_FERR(fname,"empty data file",nim->iname);
        znzclose(fp);
        return NULL;
     }
     ioff = (ii > ntot) ? ii-ntot : 0 ;
   } else {                              /* non-negative offset   */
     ioff = nim->iname_offset ;          /* means use it directly */
   }

   /**- seek to the appropriate read position */
   if( znzseek(fp , (long)ioff , SEEK_SET) < 0 ){
      fprintf(stderr,"** could not seek to offset %u in file '%s'\n",
              (unsigned)ioff, nim->iname);
      znzclose(fp);
      return NULL;
   }

   /**- and return the File pointer */
   return fp;
}